

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data-source-amiga.cc
# Opt level: O3

PSpriteAmiga __thiscall
DataSourceAmiga::make_shadow_from_symbol(DataSourceAmiga *this,PSpriteAmiga *symbol)

{
  _func_int **pp_Var1;
  undefined8 *in_RDX;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  PSpriteAmiga PVar2;
  undefined1 local_59;
  undefined8 local_58;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_50;
  undefined8 local_48;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_40;
  undefined8 local_38;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_30;
  undefined8 local_28;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_20;
  int local_18 [2];
  
  local_18[1] = 10;
  local_18[0] = 10;
  std::__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2>::
  __shared_ptr<std::allocator<DataSourceAmiga::SpriteAmiga>,int,int>
            ((__shared_ptr<DataSourceAmiga::SpriteAmiga,(__gnu_cxx::_Lock_policy)2> *)this,
             (allocator<DataSourceAmiga::SpriteAmiga> *)&local_59,local_18 + 1,local_18);
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_28 = *in_RDX;
  local_20 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_20->_M_use_count = local_20->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_20->_M_use_count = local_20->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_28,1,0);
  if (local_20 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_20);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_38 = *in_RDX;
  local_30 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_30->_M_use_count = local_30->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_30->_M_use_count = local_30->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_38,0,1);
  if (local_30 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_30);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_48 = *in_RDX;
  local_40 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_40->_M_use_count = local_40->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_40->_M_use_count = local_40->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_48,2,1);
  if (local_40 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_40);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  local_58 = *in_RDX;
  local_50 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)in_RDX[1];
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    if (__libc_single_threaded == '\0') {
      LOCK();
      local_50->_M_use_count = local_50->_M_use_count + 1;
      UNLOCK();
    }
    else {
      local_50->_M_use_count = local_50->_M_use_count + 1;
    }
  }
  (**(code **)(*pp_Var1 + 0x78))(pp_Var1,&local_58,1,2);
  if (local_50 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_50);
  }
  pp_Var1 = (this->super_DataSourceLegacy).super_DataSourceBase.super_Source._vptr_Source;
  (**(code **)(*pp_Var1 + 0x50))(pp_Var1,0xffffffff);
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
  _M_pi = extraout_RDX._M_pi;
  PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)this;
  return (PSpriteAmiga)
         PVar2.super___shared_ptr<DataSourceAmiga::SpriteAmiga,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

DataSourceAmiga::PSpriteAmiga
DataSourceAmiga::make_shadow_from_symbol(PSpriteAmiga symbol) {
  PSpriteAmiga res = std::make_shared<SpriteAmiga>(10, 10);
  res->stick(symbol, 1, 0);
  res->stick(symbol, 0, 1);
  res->stick(symbol, 2, 1);
  res->stick(symbol, 1, 2);
  res->fill_masked({0xFF, 0xFF, 0xFF, 0xFF});
  return res;
}